

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8decoder.cpp
# Opt level: O0

uint32_t decode(uint32_t *state,uint32_t *codep,uint8_t byte)

{
  byte bVar1;
  uint local_24;
  uint32_t type;
  uint8_t byte_local;
  uint32_t *codep_local;
  uint32_t *state_local;
  
  bVar1 = ""[byte];
  if (*state == 0) {
    local_24 = 0xff >> (bVar1 & 0x1f) & (uint)byte;
  }
  else {
    local_24 = byte & 0x3f | *codep << 6;
  }
  *codep = local_24;
  *state = (uint)""[*state * 0x10 + 0x100 + (uint)bVar1];
  return *state;
}

Assistant:

uint32_t decode(uint32_t *state, uint32_t *codep, uint8_t byte)
{
	uint32_t type = utf8d[byte];

	*codep = (*state != 0) ?
			(byte & 0x3FU) | (*codep << 6) :
			(0xFF >> type) & (byte);

	*state = utf8d[256 + *state * 16 + type];
	return *state;
}